

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockpacking.h
# Opt level: O2

uint32_t * __thiscall
FastPForLib::FastBinaryPacking<16U>::decodeArray
          (FastBinaryPacking<16U> *this,uint32_t *in,size_t param_2,uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t *in_00;
  uint32_t i;
  long lVar3;
  uint32_t *puVar4;
  uint32_t *out_00;
  uint32_t Bs [4];
  uint local_48 [6];
  
  uVar1 = *in;
  in_00 = in + 1;
  for (puVar4 = out; puVar4 < out + uVar1; puVar4 = puVar4 + 0x40) {
    local_48[0] = (uint)*(byte *)((long)in_00 + 3);
    local_48[1] = (uint)*(byte *)((long)in_00 + 2);
    local_48[2] = (uint)*(byte *)((long)in_00 + 1);
    uVar2 = *in_00;
    in_00 = in_00 + 1;
    local_48[3] = (uint)(byte)uVar2;
    out_00 = puVar4;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      in_00 = fastunpack_16(in_00,out_00,local_48[lVar3]);
      out_00 = out_00 + 0x10;
    }
  }
  *nvalue = (long)puVar4 - (long)out >> 2;
  return in_00;
}

Assistant:

const uint32_t *decodeArray(const uint32_t *in, const size_t /*length*/,
                              uint32_t *out, size_t &nvalue) override {
    const uint32_t actuallength = *in++;
    const uint32_t *const initout(out);
    uint32_t Bs[HowManyMiniBlocks];
    for (; out < initout + actuallength; out += BlockSize) {
      Bs[0] = static_cast<uint8_t>(in[0] >> 24);
      Bs[1] = static_cast<uint8_t>(in[0] >> 16);
      Bs[2] = static_cast<uint8_t>(in[0] >> 8);
      Bs[3] = static_cast<uint8_t>(in[0]);
      ++in;
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i) {
        if (MiniBlockSize == 8)
          in = fastunpack_8(in, out + i * MiniBlockSize, Bs[i]);
        else if (MiniBlockSize == 16)
          in = fastunpack_16(in, out + i * MiniBlockSize, Bs[i]);
        else if (MiniBlockSize == 24)
          in = fastunpack_24(in, out + i * MiniBlockSize, Bs[i]);
        else if (MiniBlockSize == 32) {
          fastunpack(in, out + i * MiniBlockSize, Bs[i]);
          in += Bs[i];
        } else
          throw std::logic_error("unsupported MiniBlockSize");
      }
    }
    nvalue = out - initout;
    return in;
  }